

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler * llama_sampler_init_xtc(float p,float t,size_t min_keep,uint32_t seed)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  llama_sampler *plVar4;
  ulong uVar5;
  
  fVar1 = (float)get_rng_seed(seed);
  pfVar2 = (float *)operator_new(0x13a0);
  *pfVar2 = p;
  pfVar2[1] = t;
  *(size_t *)(pfVar2 + 2) = min_keep;
  pfVar2[4] = (float)seed;
  pfVar2[5] = fVar1;
  uVar5 = (ulong)(uint)fVar1;
  *(ulong *)(pfVar2 + 6) = uVar5;
  lVar3 = 4;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3) - 3);
    *(ulong *)(pfVar2 + lVar3 * 2) = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x273);
  pfVar2[0x4e6] = 8.7441e-43;
  pfVar2[0x4e7] = 0.0;
  plVar4 = (llama_sampler *)operator_new(0x10);
  plVar4->iface = &llama_sampler_xtc_i;
  plVar4->ctx = pfVar2;
  return plVar4;
}

Assistant:

struct llama_sampler * llama_sampler_init_xtc(float p, float t, size_t min_keep, uint32_t seed) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_xtc_i,
        /* .ctx   = */ new llama_sampler_xtc {
            /* .probability   = */ p,
            /* .threshold     = */ t,
            /* .min_keep      = */ min_keep,
            /* .seed          = */ seed,
            /* .seed_cur      = */ seed_cur,
            /* .rng           = */ std::mt19937(seed_cur),
        }
    );
}